

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O3

void length_update_prices(lzma_length_encoder *lc,uint32_t pos_state)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  
  uVar5 = lc->table_size;
  lc->counters[pos_state] = uVar5;
  uVar9 = (ulong)(lc->choice >> 4);
  bVar1 = lzma_rc_prices[uVar9 ^ 0x7f];
  uVar8 = (ulong)(lc->choice2 >> 4);
  bVar2 = lzma_rc_prices[uVar8 ^ 0x7f];
  uVar6 = 8;
  if (uVar5 < 8) {
    uVar6 = uVar5;
  }
  if ((ulong)uVar5 == 0) {
    uVar6 = 0;
  }
  else {
    bVar3 = lzma_rc_prices[uVar8];
    bVar4 = lzma_rc_prices[uVar9];
    uVar8 = (ulong)uVar6;
    uVar9 = 0;
    do {
      iVar10 = 0;
      uVar7 = (uint)uVar9 | 8;
      do {
        uVar11 = uVar7 >> 1;
        iVar10 = iVar10 + (uint)lzma_rc_prices
                                [(-(uVar7 & 1) & 0x7f0 ^
                                 (uint)*(ushort *)
                                        ((long)lc->low[pos_state] + (ulong)(uVar7 & 0xfffffffe))) >>
                                 4];
        uVar7 = uVar11;
      } while (uVar11 != 1);
      lc->prices[pos_state][uVar9] = iVar10 + (uint)bVar4;
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar8);
    uVar7 = 0x10;
    if (uVar5 < 0x10) {
      uVar7 = uVar5;
    }
    if (8 < uVar5) {
      do {
        iVar10 = 0;
        uVar9 = uVar8 & 0xffffffff;
        do {
          uVar6 = (uint)uVar9;
          uVar9 = uVar9 >> 1;
          iVar10 = iVar10 + (uint)lzma_rc_prices
                                  [(-(uVar6 & 1) & 0x7f0 ^
                                   (uint)*(ushort *)
                                          ((long)lc->mid[pos_state] + (ulong)(uVar6 & 0xfffffffe)))
                                   >> 4];
        } while ((int)uVar9 != 1);
        lc->prices[pos_state][uVar8] = iVar10 + (uint)bVar3 + (uint)bVar1;
        uVar8 = uVar8 + 1;
        uVar6 = uVar7;
      } while (uVar8 != uVar7);
    }
  }
  if (uVar6 < uVar5) {
    uVar8 = (ulong)uVar6;
    do {
      iVar10 = 0;
      uVar6 = (int)uVar8 + 0xf0;
      do {
        uVar7 = uVar6 >> 1;
        iVar10 = iVar10 + (uint)lzma_rc_prices
                                [(-(uVar6 & 1) & 0x7f0 ^
                                 (uint)*(ushort *)((long)lc->high + (ulong)(uVar6 & 0xfffffffe))) >>
                                 4];
        uVar6 = uVar7;
      } while (uVar7 != 1);
      lc->prices[pos_state][uVar8] = iVar10 + (uint)bVar2 + (uint)bVar1;
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar5);
  }
  return;
}

Assistant:

static void
length_update_prices(lzma_length_encoder *lc, const uint32_t pos_state)
{
	uint32_t a0, a1, b0, b1;
	uint32_t *prices;
	uint32_t i;

	const uint32_t table_size = lc->table_size;
	lc->counters[pos_state] = table_size;

	a0 = rc_bit_0_price(lc->choice);
	a1 = rc_bit_1_price(lc->choice);
	b0 = a1 + rc_bit_0_price(lc->choice2);
	b1 = a1 + rc_bit_1_price(lc->choice2);
	prices = lc->prices[pos_state];

	for (i = 0; i < table_size && i < LEN_LOW_SYMBOLS; ++i)
		prices[i] = a0 + rc_bittree_price(lc->low[pos_state],
				LEN_LOW_BITS, i);

	for (; i < table_size && i < LEN_LOW_SYMBOLS + LEN_MID_SYMBOLS; ++i)
		prices[i] = b0 + rc_bittree_price(lc->mid[pos_state],
				LEN_MID_BITS, i - LEN_LOW_SYMBOLS);

	for (; i < table_size; ++i)
		prices[i] = b1 + rc_bittree_price(lc->high, LEN_HIGH_BITS,
				i - LEN_LOW_SYMBOLS - LEN_MID_SYMBOLS);

	return;
}